

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O3

MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *
vkt::BindingModel::anon_unknown_1::allocateAndBindObjectMemory
          (MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *__return_storage_ptr__,
          DeviceInterface *vki,VkDevice device,Allocator *allocator,VkBuffer buffer,
          MemoryRequirement requirement)

{
  Allocation *pAVar1;
  VkResult result;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *extraout_RAX;
  VkMemoryRequirements requirements;
  VkMemoryRequirements VStack_48;
  
  ::vk::getBufferMemoryRequirements(&VStack_48,vki,device,buffer);
  (*allocator->_vptr_Allocator[3])
            (__return_storage_ptr__,allocator,&VStack_48,(ulong)requirement.m_flags);
  pAVar1 = (__return_storage_ptr__->
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>).m_data.ptr;
  result = (*vki->_vptr_DeviceInterface[0xc])
                     (vki,device,buffer.m_internal,(pAVar1->m_memory).m_internal,pAVar1->m_offset);
  ::vk::checkResult(result,
                    "vki.bindBufferMemory(device, buffer, allocation->getMemory(), allocation->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/binding_model/vktBindingShaderAccessTests.cpp"
                    ,0x16b);
  return extraout_RAX;
}

Assistant:

de::MovePtr<vk::Allocation> allocateAndBindObjectMemory (const vk::DeviceInterface& vki, vk::VkDevice device, vk::Allocator& allocator, vk::VkBuffer buffer, vk::MemoryRequirement requirement)
{
	const vk::VkMemoryRequirements	requirements	= vk::getBufferMemoryRequirements(vki, device, buffer);
	de::MovePtr<vk::Allocation>		allocation		= allocator.allocate(requirements, requirement);

	VK_CHECK(vki.bindBufferMemory(device, buffer, allocation->getMemory(), allocation->getOffset()));
	return allocation;
}